

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

_Bool golf_geo_generator_data_get_arg
                (golf_geo_generator_data_t *data,char *name,golf_geo_generator_data_arg_t **arg)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  golf_geo_generator_data_arg_t *__s1;
  bool bVar5;
  
  uVar3 = (ulong)(data->args).length;
  bVar5 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    __s1 = (data->args).data;
    iVar2 = strcmp(__s1->name,name);
    if (iVar2 != 0) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar3 == uVar4) {
          return uVar4 < uVar3;
        }
        __s1 = __s1 + 1;
        iVar2 = strcmp(__s1->name,name);
        uVar1 = uVar4 + 1;
      } while (iVar2 != 0);
      bVar5 = uVar4 < uVar3;
    }
    *arg = __s1;
  }
  return bVar5;
}

Assistant:

bool golf_geo_generator_data_get_arg(golf_geo_generator_data_t *data, const char *name, golf_geo_generator_data_arg_t **arg) {
    for (int i = 0; i < data->args.length; i++) {
        if (strcmp(data->args.data[i].name, name) == 0) {
            *arg = &data->args.data[i];
            return true;
        }
    }
    return false;
}